

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_ordinaryFunction_directApply
          (sysbvm_context_t *context,sysbvm_tuple_t function,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  ulong uVar1;
  int iVar2;
  sysbvm_tuple_t sVar3;
  long lVar4;
  sysbvm_bitflags_t in_R9;
  
  if (*(long *)(function + 0x50) != 0) {
    sysbvm_primitiveTable_ensureIsComputed();
    uVar1 = *(ulong *)(function + 0x50);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      iVar2 = (int)(uVar1 >> 4);
    }
    else {
      iVar2 = *(int *)(uVar1 + 0x10);
    }
    if (iVar2 - 1U < sysbvm_primitiveTableSize) {
      sVar3 = sysbvm_ordinaryFunction_nativeApply
                        (context,function,sysbvm_primitiveTable[iVar2 - 1U].entryPoint,argumentCount
                         ,arguments,in_R9);
      return sVar3;
    }
  }
  lVar4 = *(long *)(function + 0x48);
  if (lVar4 == 0) {
    sysbvm_error("Cannot apply a function without a proper definition.");
    lVar4 = *(long *)(function + 0x48);
  }
  if (*(long *)(lVar4 + 0x80) != 0) {
    sVar3 = sysbvm_bytecodeInterpreter_apply(context,function,argumentCount,arguments);
    return sVar3;
  }
  sVar3 = sysbvm_interpreter_applyClosureASTFunction
                    (context,function,argumentCount,arguments,applicationFlags);
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_ordinaryFunction_directApply(sysbvm_context_t *context, sysbvm_tuple_t function, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    sysbvm_function_t *functionObject = (sysbvm_function_t*)function;

    // Find the entry point in the primitive table.
    if(functionObject->primitiveTableIndex)
    {
        sysbvm_primitiveTable_ensureIsComputed();
        uint32_t primitiveNumber = sysbvm_tuple_uint32_decode(functionObject->primitiveTableIndex);
        if(primitiveNumber > 0 && primitiveNumber <= sysbvm_primitiveTableSize)
            return sysbvm_ordinaryFunction_nativeApply(context, function, sysbvm_primitiveTable[primitiveNumber - 1].entryPoint, argumentCount, arguments, applicationFlags);
    }
    
    if(!functionObject->definition)
        sysbvm_error("Cannot apply a function without a proper definition.");

    // Attempt to use the bytecode.
    sysbvm_functionDefinition_t *definition = (sysbvm_functionDefinition_t*)functionObject->definition;
    if(sysbvm_function_useBytecodeInterpreter && definition->bytecode)
        return sysbvm_bytecodeInterpreter_apply(context, function, argumentCount, arguments);
    
    return sysbvm_interpreter_applyClosureASTFunction(context, function, argumentCount, arguments, applicationFlags);
}